

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTestInstance::~ShaderPackingFunctionTestInstance
          (ShaderPackingFunctionTestInstance *this)

{
  ShaderPackingFunctionTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_016b6f70;
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniquePtr(&this->m_executor);
  ShaderSpec::~ShaderSpec(&this->m_spec);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

ShaderPackingFunctionTestInstance	(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
											: TestInstance	(context)
											, m_testCtx		(context.getTestContext())
											, m_shaderType	(shaderType)
											, m_spec		(spec)
											, m_name		(name)
											, m_executor	(createExecutor(context, m_shaderType, m_spec))
										{
										}